

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-data.hpp
# Opt level: O0

void __thiscall helics::Message::Message(Message *this)

{
  SmallBuffer *pSVar1;
  SmallBuffer *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  
  (in_RDI->buffer)._M_elems[0] = 0;
  (in_RDI->buffer)._M_elems[1] = 0;
  (in_RDI->buffer)._M_elems[2] = 0;
  (in_RDI->buffer)._M_elems[3] = 0;
  (in_RDI->buffer)._M_elems[4] = 0;
  (in_RDI->buffer)._M_elems[5] = 0;
  (in_RDI->buffer)._M_elems[6] = 0;
  (in_RDI->buffer)._M_elems[7] = 0;
  (in_RDI->buffer)._M_elems[8] = 0;
  (in_RDI->buffer)._M_elems[9] = 0;
  (in_RDI->buffer)._M_elems[10] = 0;
  (in_RDI->buffer)._M_elems[0xb] = 0;
  (in_RDI->buffer)._M_elems[0xc] = 0;
  (in_RDI->buffer)._M_elems[0xd] = 0;
  (in_RDI->buffer)._M_elems[0xe] = 0;
  (in_RDI->buffer)._M_elems[0xf] = 0;
  SmallBuffer::SmallBuffer(in_RDI);
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  pSVar1 = in_RDI + 2;
  (pSVar1->buffer)._M_elems[0x30] = 0;
  (pSVar1->buffer)._M_elems[0x31] = 0;
  (pSVar1->buffer)._M_elems[0x32] = 0;
  (pSVar1->buffer)._M_elems[0x33] = 0;
  pSVar1 = in_RDI + 2;
  (pSVar1->buffer)._M_elems[0x38] = 0;
  (pSVar1->buffer)._M_elems[0x39] = 0;
  (pSVar1->buffer)._M_elems[0x3a] = 0;
  (pSVar1->buffer)._M_elems[0x3b] = 0;
  (pSVar1->buffer)._M_elems[0x3c] = 0;
  (pSVar1->buffer)._M_elems[0x3d] = 0;
  (pSVar1->buffer)._M_elems[0x3e] = 0;
  (pSVar1->buffer)._M_elems[0x3f] = 0;
  return;
}

Assistant:

Message() = default;